

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ExpectationBase * __thiscall
testing::internal::
FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>::
UntypedFindMatchingExpectation
          (FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
           *this,void *untyped_args,void **untyped_action,bool *is_excessive,ostream *what,
          ostream *why)

{
  int *piVar1;
  element_type *peVar2;
  pointer psVar3;
  TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *this_00;
  simple_struct *x;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *pAVar7;
  _Rb_tree_node_base *p_Var8;
  size_t sVar9;
  ostream *poVar10;
  FailureReporterInterface *pFVar11;
  int iVar12;
  bool *pbVar13;
  char *pcVar14;
  pointer psVar15;
  long lVar16;
  bool *pbVar17;
  TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *this_01;
  size_type __dnew;
  type matcher;
  StringMatchResultListener listener;
  string local_218;
  _Rb_tree_node_base *local_1f8;
  bool *local_1f0;
  bool *local_1e8;
  MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> local_1e0;
  undefined1 local_1c8 [8];
  ostream *local_1c0;
  _Rb_tree_node_base *local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  _Base_ptr local_1a0;
  ios_base local_148 [16];
  _Rb_tree_node_base a_Stack_138 [8];
  
  local_1f8 = (_Rb_tree_node_base *)untyped_action;
  local_1f0 = is_excessive;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  psVar15 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
            super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar15 ==
        (this->super_UntypedFunctionMockerBase).untyped_expectations_.
        super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_01 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                 *)0x0;
      break;
    }
    this_01 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
               *)psVar15[-1].
                 super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    ExpectationBase::CheckActionCountIfNotDone((ExpectationBase *)this_01);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    if (((this_01->super_ExpectationBase).retired_ == false) &&
       (bVar5 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this_01), bVar5)) {
      bVar5 = TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
              ::Matches(this_01,(ArgumentTuple *)untyped_args);
    }
    else {
      bVar5 = false;
    }
    psVar15 = psVar15 + -1;
  } while (bVar5 == false);
  if (this_01 ==
      (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0)
  {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    std::__ostream_insert<char,std::char_traits<char>>
              (what,"\nUnexpected mock function call - ",0x21);
    DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,what);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    psVar15 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
              super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
             super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>(why,"Google Mock tried the following ",0x20);
    lVar16 = (long)psVar3 - (long)psVar15;
    local_1f0 = (bool *)(lVar16 >> 4);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)why);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pcVar14 = "expectations, but none matched";
    if (lVar16 == 0x10) {
      pcVar14 = "expectation, but it didn\'t match";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,pcVar14,(ulong)(lVar16 == 0x10) * 2 + 0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n",2);
    if (psVar3 == psVar15) {
      this_01 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                 *)0x0;
    }
    else {
      local_1f8 = a_Stack_138;
      pbVar13 = local_1f0 + (local_1f0 == (bool *)0x0);
      this_01 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                 *)0x0;
      pbVar17 = (bool *)0x0;
      local_1e8 = pbVar13;
      do {
        this_00 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                   *)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pbVar17].
                     super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
        std::__ostream_insert<char,std::char_traits<char>>(why,"\n",1);
        ExpectationBase::DescribeLocationTo((ExpectationBase *)this_00,why);
        if ((bool *)0x1 < local_1f0) {
          std::__ostream_insert<char,std::char_traits<char>>(why,"tried expectation #",0x13);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)why);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
        }
        pcVar14 = (this_00->super_ExpectationBase).source_text_._M_dataplus._M_p;
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)why + (int)*(undefined8 *)(*(long *)why + -0x18));
        }
        else {
          sVar9 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(why,pcVar14,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(why,"...\n",4);
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        if ((this_00->super_ExpectationBase).retired_ == true) {
          lVar16 = 0x21;
          std::__ostream_insert<char,std::char_traits<char>>
                    (why,"         Expected: the expectation is active\n",0x2d);
          pcVar14 = "           Actual: it is retired\n";
LAB_00128102:
          std::__ostream_insert<char,std::char_traits<char>>(why,pcVar14,lVar16);
        }
        else {
          bVar5 = TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                  ::Matches(this_00,(ArgumentTuple *)untyped_args);
          if (bVar5) {
            bVar5 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this_00);
            lVar16 = 0x22;
            pcVar14 = "The call matches the expectation.\n";
            if (bVar5) goto LAB_00128102;
            std::__ostream_insert<char,std::char_traits<char>>
                      (why,"         Expected: all pre-requisites are satisfied\n",0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      (why,"           Actual: the following immediate pre-requisites ",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>(why,"are not satisfied:\n",0x13);
            local_1c0 = (ostream *)((ulong)local_1c0 & 0xffffffff00000000);
            local_1b8 = (_Rb_tree_node_base *)0x0;
            local_1a0 = (_Base_ptr)0x0;
            local_1b0 = (_Rb_tree_node_base *)&local_1c0;
            local_1a8 = (_Rb_tree_node_base *)&local_1c0;
            ExpectationBase::FindUnsatisfiedPrerequisites
                      ((ExpectationBase *)this_00,(ExpectationSet *)local_1c8);
            if (local_1b0 != (_Rb_tree_node_base *)&local_1c0) {
              iVar6 = 0;
              p_Var8 = local_1b0;
              do {
                ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var8 + 1),why);
                std::__ostream_insert<char,std::char_traits<char>>(why,"pre-requisite #",0xf);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)why,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                iVar6 = iVar6 + 1;
              } while (p_Var8 != (_Rb_tree_node_base *)&local_1c0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (why,"                   (end of pre-requisites)\n",0x2b);
            std::
            _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
            ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                         *)local_1c8);
            pbVar13 = local_1e8;
          }
          else {
            local_1c0 = (ostream *)0x0;
            local_1c8 = (undefined1  [8])&PTR__MatchResultListener_00197638;
            bVar5 = MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
                    MatchAndExplain((MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                                     *)&this_00->matchers_,*untyped_args,
                                    (MatchResultListener *)local_1c8);
            if (!bVar5) {
              local_1e0.vtable_ =
                   (this_00->matchers_).
                   super__Tuple_impl<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_>
                   .
                   super__Head_base<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>,_false>
                   ._M_head_impl.
                   super_MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>.
                   vtable_;
              local_1e0.buffer_ =
                   (Buffer)(this_00->matchers_).
                           super__Tuple_impl<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_>
                           .
                           super__Head_base<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>,_false>
                           ._M_head_impl.
                           super_MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                           .buffer_.shared;
              if ((local_1e0.vtable_ != (VTable *)0x0) &&
                 ((local_1e0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
                LOCK();
                ((local_1e0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
                     ((local_1e0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_1e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
                   (_func_int **)&PTR__MatcherBase_00198048;
              x = *untyped_args;
              local_1c0 = (ostream *)&local_1a8;
              local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00197760;
              std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
              bVar5 = MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
                      MatchAndExplain(&local_1e0,x,(MatchResultListener *)local_1c8);
              if (!bVar5) {
                std::__ostream_insert<char,std::char_traits<char>>(why,"  Expected arg #",0x10);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)why);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
                MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
                DescribeTo((MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                            *)&this_00->matchers_,why);
                std::__ostream_insert<char,std::char_traits<char>>(why,"\n           Actual: ",0x14)
                ;
                PrintBytesInObjectTo((uchar *)x,4,why);
                std::__cxx11::stringbuf::str();
                iVar6 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar6 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(why,", ",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (why,local_218._M_dataplus._M_p,local_218._M_string_length);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>(why,"\n",1);
              }
              local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00197760;
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
              std::ios_base::~ios_base((ios_base *)local_1f8);
              MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
              ~MatcherBase(&local_1e0);
              pbVar13 = local_1e8;
            }
            local_1c0 = (ostream *)&local_1a8;
            local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00197760;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
            bVar5 = MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                    ::MatchAndExplain(&(this_00->extra_matcher_).
                                       super_MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                                      ,(tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                                        *)untyped_args,(MatchResultListener *)local_1c8);
            if (!bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>(why,"    Expected args: ",0x13);
              MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
              ::DescribeTo(&(this_00->extra_matcher_).
                            super_MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                           ,why);
              std::__ostream_insert<char,std::char_traits<char>>
                        (why,"\n           Actual: don\'t match",0x1f);
              std::__cxx11::stringbuf::str();
              iVar6 = std::__cxx11::string::compare((char *)&local_218);
              if (iVar6 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(why,", ",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (why,local_218._M_dataplus._M_p,local_218._M_string_length);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(why,"\n",1);
            }
            local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00197760;
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
            std::ios_base::~ios_base((ios_base *)local_1f8);
          }
        }
        ExpectationBase::DescribeCallCountTo((ExpectationBase *)this_00,why);
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar13);
    }
  }
  else {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    peVar2 = (this_01->super_ExpectationBase).cardinality_.impl_.
             super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar6 = (*peVar2->_vptr_CardinalityInterface[5])
                      (peVar2,(ulong)(uint)(this_01->super_ExpectationBase).call_count_);
    *local_1f0 = SUB41(iVar6,0);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    peVar2 = (this_01->super_ExpectationBase).cardinality_.impl_.
             super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar6 = (*peVar2->_vptr_CardinalityInterface[5])
                      (peVar2,(ulong)(uint)(this_01->super_ExpectationBase).call_count_);
    if ((char)iVar6 == '\0') {
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      piVar1 = &(this_01->super_ExpectationBase).call_count_;
      *piVar1 = *piVar1 + 1;
      ExpectationBase::RetireAllPreRequisites(&this_01->super_ExpectationBase);
      if ((this_01->super_ExpectationBase).retires_on_saturation_ == true) {
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        peVar2 = (this_01->super_ExpectationBase).cardinality_.impl_.
                 super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar6 = (*peVar2->_vptr_CardinalityInterface[5])
                          (peVar2,(ulong)(uint)(this_01->super_ExpectationBase).call_count_);
        if ((char)iVar6 != '\0') {
          MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
          (this_01->super_ExpectationBase).retired_ = true;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(what,"Mock function call matches ",0x1b);
      pcVar14 = (this_01->super_ExpectationBase).source_text_._M_dataplus._M_p;
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(*(long *)what + -0x18) + (int)what);
      }
      else {
        sVar9 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(what,pcVar14,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(what,"...\n",4);
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      iVar6 = (this_01->super_ExpectationBase).call_count_;
      local_218._M_dataplus._M_p = (pointer)0x52;
      local_1c8 = (undefined1  [8])&local_1b8;
      poVar10 = (ostream *)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)&local_218);
      _Var4._M_p = local_218._M_dataplus._M_p;
      local_1b8 = (_Rb_tree_node_base *)local_218._M_dataplus._M_p;
      local_1c8 = (undefined1  [8])poVar10;
      memcpy(poVar10,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             0x52);
      local_1c0 = (ostream *)_Var4._M_p;
      poVar10[(long)_Var4._M_p] = (ostream)0x0;
      if (iVar6 < 1) {
        pFVar11 = GetFailureReporter();
        (*pFVar11->_vptr_FailureReporterInterface[2])
                  (pFVar11,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-spec-builders.h"
                   ,0x494,local_1c8);
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->_M_color + 1));
      }
      iVar12 = (int)((ulong)((long)(this_01->super_ExpectationBase).untyped_actions_.
                                   super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_01->super_ExpectationBase).untyped_actions_.
                                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (((0 < iVar12) && (iVar12 < iVar6)) &&
         ((this_01->super_ExpectationBase).repeated_action_specified_ == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        ExpectationBase::DescribeLocationTo(&this_01->super_ExpectationBase,(ostream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Actions ran out in ",0x13);
        pcVar14 = (this_01->super_ExpectationBase).source_text_._M_dataplus._M_p;
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)local_1b8[-1]._M_parent + (int)(ostream *)&local_1b8);
        }
        else {
          sVar9 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,pcVar14,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"Called ",7);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_1b8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," times, but only ",0x11);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," WillOnce()",0xb);
        pcVar14 = "s are";
        if (iVar12 == 1) {
          pcVar14 = " is";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,pcVar14,(ulong)(iVar12 != 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," specified - ",0xd);
        DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,(ostream *)&local_1b8);
        std::__cxx11::stringbuf::str();
        Log(kWarning,&local_218,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
      }
      if (iVar12 < iVar6) {
        pAVar7 = &this_01->repeated_action_;
      }
      else {
        pAVar7 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)
                 (this_01->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)iVar6 + -1];
      }
    }
    else {
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      piVar1 = &(this_01->super_ExpectationBase).call_count_;
      *piVar1 = *piVar1 + 1;
      std::__ostream_insert<char,std::char_traits<char>>
                (what,"Mock function called more times than expected - ",0x30);
      DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,what);
      ExpectationBase::DescribeCallCountTo(&this_01->super_ExpectationBase,why);
      pAVar7 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0;
    }
    if (pAVar7 == (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)
                  0x0) {
      pAVar7 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0;
    }
    else if ((pAVar7->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      pAVar7 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0;
    }
    *(Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> **)local_1f8 =
         pAVar7;
  }
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  return &this_01->super_ExpectationBase;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }